

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O1

void __thiscall Psbt_UsecaseMultisig_Test::TestBody(Psbt_UsecaseMultisig_Test *this)

{
  undefined **ppuVar1;
  AssertHelperData *pAVar2;
  undefined8 uVar3;
  bool bVar4;
  pointer pSVar5;
  long lVar6;
  _func_int *message;
  _func_int **message_00;
  char *pcVar7;
  pointer puVar8;
  Amount *value;
  ulong uVar9;
  size_t sVar10;
  Amount AVar11;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::KeyData> __l_01;
  initializer_list<cfd::core::ByteData> __l_02;
  AssertionResult gtest_ar_5;
  ByteData256 sighash;
  AssertionResult gtest_ar_4;
  SigHashType sighash_type;
  ByteData sig;
  Psbt psbt1;
  Psbt psbt2;
  Psbt psbt;
  TxOut utxo_txout;
  string path1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wsh_script;
  ByteData sig2;
  AssertionResult gtest_ar_12;
  HDWallet wallet2;
  HDWallet wallet1;
  string in_path;
  Amount amount;
  Script multisig;
  TxIn txin;
  Transaction utxo_tx;
  Script out_multisig;
  Address addr;
  KeyData key_in2;
  KeyData key_in1;
  KeyData key2;
  KeyData key1;
  undefined1 local_d88 [16];
  undefined1 auStack_d78 [48];
  undefined1 local_d48 [32];
  undefined1 local_d28 [64];
  undefined1 local_ce8 [32];
  pointer local_cc8;
  pointer pTStack_cc0;
  undefined1 local_cb8 [24];
  Script local_ca0;
  Psbt local_c68;
  Psbt local_c18;
  undefined1 local_bc8 [32];
  pointer pSStack_ba8;
  pointer local_ba0;
  pointer local_b98;
  pointer pSStack_b90;
  pointer local_b88;
  ByteData local_b80 [11];
  KeyData local_a78;
  string local_928;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_908;
  undefined1 local_8f0 [24];
  internal local_8d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d0;
  HDWallet local_8c8;
  HDWallet local_8b0;
  string local_898;
  ByteData local_878;
  ByteData local_860;
  SigHashType local_844;
  Amount local_838;
  Script local_828;
  AbstractTxIn local_7f0;
  Transaction local_760;
  Script local_720;
  undefined1 local_6e8 [48];
  pointer local_6b8;
  pointer local_6a0;
  pointer local_688;
  TapBranch local_670;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5f8;
  Script local_5e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5a0;
  KeyData local_570;
  KeyData local_420;
  KeyData local_2d0;
  KeyData local_180;
  
  cfd::core::Psbt::Psbt(&local_c18);
  cfd::core::ByteData::ByteData((ByteData *)local_bc8,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_8b0,(ByteData *)local_bc8);
  if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_bc8._0_8_);
  }
  cfd::core::ByteData::ByteData((ByteData *)local_bc8,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_8c8,(ByteData *)local_bc8);
  if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_bc8._0_8_);
  }
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"44h/0h/0h/0/12","");
  cfd::core::HDWallet::GeneratePubkeyData(&local_180,&local_8b0,kTestnet,&local_928);
  cfd::core::HDWallet::GeneratePubkeyData(&local_2d0,&local_8c8,kTestnet,&local_928);
  cfd::core::KeyData::GetPubkey((Pubkey *)local_bc8,&local_180);
  cfd::core::KeyData::GetPubkey((Pubkey *)(local_bc8 + 0x18),&local_2d0);
  __l._M_len = 2;
  __l._M_array = (Pubkey *)local_bc8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_6e8,__l,
             (allocator_type *)&local_420);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_720,2,(vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_6e8
             ,true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_6e8);
  lVar6 = 0x18;
  do {
    if (*(void **)(local_bc8 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_bc8 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cfd::core::Address::Address((Address *)local_6e8,kCfdIllegalArgumentError,kVersion0,&local_720);
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"44h/0h/0h/0/11","");
  cfd::core::HDWallet::GeneratePrivkeyData(&local_420,&local_8b0,kTestnet,&local_898);
  cfd::core::HDWallet::GeneratePrivkeyData(&local_570,&local_8c8,kTestnet,&local_898);
  cfd::core::KeyData::GetPubkey((Pubkey *)local_bc8,&local_420);
  cfd::core::KeyData::GetPubkey((Pubkey *)(local_bc8 + 0x18),&local_570);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_bc8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_7f0,__l_00,
             (allocator_type *)local_cb8);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_828,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_7f0,true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&local_7f0);
  lVar6 = 0x18;
  do {
    if (*(void **)(local_bc8 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_bc8 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_bc8,&local_828);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7f0,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"multisig.GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,(char *)local_bc8._0_8_);
  ppuVar1 = (undefined **)(local_bc8 + 0x10);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if ((char)local_7f0._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)local_bc8);
    if (local_7f0.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x5bc76e;
    }
    else {
      message = *local_7f0.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x30d,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cb8,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cb8);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7f0.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::Transaction::Transaction(&local_760,&g_psbt_utxo_sh_wsh_multi_abi_cxx11_);
  pAVar2 = (AssertHelperData *)(local_cb8 + 0x10);
  local_cb8._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cb8,"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",
             "");
  cfd::core::Txid::Txid((Txid *)local_bc8,(string *)local_cb8);
  cfd::core::TxIn::TxIn((TxIn *)&local_7f0,(Txid *)local_bc8,0,0xffffffff);
  local_bc8._0_8_ = &PTR__Txid_0068dcd8;
  if ((pointer)local_bc8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_bc8._8_8_);
  }
  if ((AssertHelperData *)local_cb8._0_8_ != pAVar2) {
    operator_delete((void *)local_cb8._0_8_);
  }
  cfd::core::Psbt::AddTxIn(&local_c18,(TxIn *)&local_7f0);
  cfd::core::Transaction::GetTxOut((TxOutReference *)local_cb8,&local_760,0);
  cfd::core::KeyData::KeyData((KeyData *)local_bc8);
  cfd::core::Psbt::SetTxInUtxo
            (&local_c18,0,(TxOutReference *)local_cb8,&local_828,(KeyData *)local_bc8);
  cfd::core::KeyData::~KeyData((KeyData *)local_bc8);
  local_cb8._0_8_ = &PTR__AbstractTxOutReference_00693fb8;
  cfd::core::Script::~Script(&local_ca0);
  cfd::core::SigHashType::SigHashType((SigHashType *)local_bc8);
  cfd::core::Psbt::SetTxInSighashType(&local_c18,0,(SigHashType *)local_bc8);
  cfd::core::Psbt::GetTxInRedeemScriptDirect((Script *)local_bc8,&local_c18,0,true,true);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_cb8,(Script *)local_bc8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c68,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,(char *)local_cb8._0_8_);
  if ((AssertHelperData *)local_cb8._0_8_ != pAVar2) {
    operator_delete((void *)local_cb8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_bc8);
  if ((char)local_c68._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)local_bc8);
    if ((undefined8 *)local_c68.wally_psbt_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_c68.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x317,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cb8,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cb8);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c68.wally_psbt_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetTxInRedeemScriptDirect((Script *)local_bc8,&local_c18,0,true,false);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_cb8,(Script *)local_bc8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c68,
             "\"00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9\"",
             "psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str()",
             "00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
             (char *)local_cb8._0_8_);
  if ((AssertHelperData *)local_cb8._0_8_ != pAVar2) {
    operator_delete((void *)local_cb8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_bc8);
  if ((char)local_c68._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)local_bc8);
    if ((undefined8 *)local_c68.wally_psbt_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_c68.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x319,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cb8,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cb8);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c68.wally_psbt_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Amount::Amount(&local_838,0x1dcd4b10);
  cfd::core::Address::GetLockingScript((Script *)local_bc8,(Address *)local_6e8);
  cfd::core::Psbt::AddTxOut(&local_c18,(Script *)local_bc8,&local_838);
  cfd::core::Script::~Script((Script *)local_bc8);
  cfd::core::KeyData::KeyData((KeyData *)local_bc8,&local_180);
  cfd::core::KeyData::KeyData(&local_a78,&local_2d0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_bc8;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cb8,__l_01,
             (allocator_type *)&local_c68);
  cfd::core::Psbt::SetTxOutData
            (&local_c18,0,&local_720,
             (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cb8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cb8);
  lVar6 = 0x150;
  do {
    cfd::core::KeyData::~KeyData((KeyData *)(local_bc8 + lVar6));
    lVar6 = lVar6 + -0x150;
  } while (lVar6 != -0x150);
  cfd::core::Psbt::Psbt((Psbt *)local_cb8);
  cfd::core::Psbt::AddTxIn((Psbt *)local_cb8,(TxIn *)&local_7f0);
  cfd::core::Transaction::GetTxOut((TxOutReference *)local_bc8,&local_760,0);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_cb8,0,(TxOutReference *)local_bc8,&local_828,&local_420);
  local_bc8._0_8_ = &PTR__AbstractTxOutReference_00693fb8;
  cfd::core::Script::~Script((Script *)(local_bc8 + 0x18));
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_bc8,(Psbt *)local_cb8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c68,
             "\"cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAA\""
             ,"psbt1.GetBase64().c_str()",
             "cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAA"
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if ((char)local_c68._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)local_bc8);
    if ((undefined8 *)local_c68.wally_psbt_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_c68.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x32c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d28,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d28);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c68.wally_psbt_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::Psbt(&local_c68);
  cfd::core::Psbt::AddTxIn(&local_c68,(TxIn *)&local_7f0);
  cfd::core::Transaction::GetTxOut((TxOutReference *)local_bc8,&local_760,0);
  cfd::core::Psbt::SetTxInUtxo(&local_c68,0,(TxOutReference *)local_bc8,&local_828,&local_570);
  local_bc8._0_8_ = &PTR__AbstractTxOutReference_00693fb8;
  cfd::core::Script::~Script((Script *)(local_bc8 + 0x18));
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_bc8,&local_c68);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d28,
             "\"cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAA\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAA"
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if (local_d28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_bc8);
    if ((pointer)local_d28._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_d28._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x336,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d88,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d88);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d28 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::Join(&local_c18,(Psbt *)local_cb8,false);
  cfd::core::Psbt::Join(&local_c18,&local_c68,false);
  cfd::core::Psbt::GetData((ByteData *)local_d28,&local_c18);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_bc8,(ByteData *)local_d28);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d88,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if ((AssertHelperData *)local_d28._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d28._0_8_);
  }
  if (local_d88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_bc8);
    if ((pointer)local_d88._8_8_ == (pointer)0x0) {
      message_00 = (_func_int **)0x5bc76e;
    }
    else {
      message_00 = ((AbstractTxIn *)local_d88._8_8_)->_vptr_AbstractTxIn;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x33f,(char *)message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d28,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d28);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_bc8,&local_c18);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d28,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if (local_d28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_bc8);
    if ((pointer)local_d28._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_d28._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x340,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d88,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d88);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d28 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::operator=((Psbt *)local_cb8,&local_c18);
  cfd::core::KeyData::GetPrivkey((Privkey *)local_bc8,&local_420);
  cfd::core::Psbt::Sign((Psbt *)local_cb8,(Privkey *)local_bc8,true);
  if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_bc8._0_8_);
  }
  cfd::core::Psbt::operator=(&local_c68,&local_c18);
  cfd::core::Psbt::GetTxInSighashType((Psbt *)local_ce8,(uint32_t)&local_c18);
  cfd::core::Psbt::GetTxInUtxo((TxOut *)local_bc8,&local_c18,0,false,(bool *)0x0);
  cfd::core::Psbt::GetTransaction((Transaction *)local_d28,&local_c18);
  cfd::core::Psbt::GetTxInRedeemScript((Script *)local_d88,&local_c18,0,false,(bool *)0x0);
  cfd::core::Script::GetData((ByteData *)(local_ce8 + 0x18),(Script *)local_d88);
  cfd::core::SigHashType::SigHashType(&local_844,(SigHashType *)local_ce8);
  AVar11 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)local_bc8);
  local_8f0._0_8_ = AVar11.amount_;
  value = (Amount *)local_8f0;
  local_8f0[8] = AVar11.ignore_check_;
  cfd::core::Transaction::GetSignatureHash
            ((ByteData256 *)local_d48,(Transaction *)local_d28,0,(ByteData *)(local_ce8 + 0x18),
             &local_844,value,kVersion0);
  if ((void *)local_ce8._24_8_ != (void *)0x0) {
    operator_delete((void *)local_ce8._24_8_);
  }
  cfd::core::Script::~Script((Script *)local_d88);
  cfd::core::KeyData::GetPrivkey((Privkey *)local_d88,&local_570);
  cfd::core::Privkey::CalculateEcSignature
            ((ByteData *)(local_ce8 + 0x18),(Privkey *)local_d88,(ByteData256 *)local_d48,true);
  if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d88._0_8_);
  }
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)local_d88,(ByteData *)(local_ce8 + 0x18),(SigHashType *)local_ce8);
  uVar3 = local_ce8._24_8_;
  local_ce8._24_8_ = local_d88._0_8_;
  local_cc8 = (pointer)local_d88._8_8_;
  pTStack_cc0 = (pointer)auStack_d78._0_8_;
  local_d88._0_8_ = (AssertHelperData *)0x0;
  local_d88._8_8_ = (pointer)0x0;
  auStack_d78._0_8_ = (pointer)0x0;
  if ((void *)uVar3 != (void *)0x0) {
    operator_delete((void *)uVar3);
  }
  if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d88._0_8_);
  }
  cfd::core::Psbt::SetTxInSignature(&local_c68,0,&local_570,(ByteData *)(local_ce8 + 0x18));
  if ((AssertHelperData *)local_ce8._24_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_ce8._24_8_);
  }
  if ((AssertHelperData *)local_d48._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d48._0_8_);
  }
  cfd::core::Transaction::~Transaction((Transaction *)local_d28);
  local_bc8._0_8_ = &PTR__AbstractTxOut_006a6570;
  cfd::core::Script::~Script((Script *)(local_bc8 + 0x18));
  cfd::core::Psbt::Combine(&local_c18,(Psbt *)local_cb8);
  cfd::core::Psbt::Combine(&local_c18,&local_c68);
  cfd::core::Psbt::GetData((ByteData *)local_d28,&local_c18);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_bc8,(ByteData *)local_d28);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d88,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if ((AssertHelperData *)local_d28._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_d28._0_8_);
  }
  if (local_d88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_bc8);
    if ((pointer)local_d88._8_8_ == (pointer)0x0) {
      puVar8 = "";
    }
    else {
      puVar8 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d88._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x362,(char *)puVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d28,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d28);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_bc8,&local_c18);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d28,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if (local_d28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_bc8);
    if ((pointer)local_d28._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_d28._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x363,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d88,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d88);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d28 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::KeyData::GetPubkey((Pubkey *)local_bc8,&local_420);
  cfd::core::Psbt::GetTxInSignature((ByteData *)(local_ce8 + 0x18),&local_c18,0,(Pubkey *)local_bc8)
  ;
  if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_bc8._0_8_);
  }
  cfd::core::KeyData::GetPubkey((Pubkey *)local_bc8,&local_570);
  cfd::core::Psbt::GetTxInSignature((ByteData *)local_8f0,&local_c18,0,(Pubkey *)local_bc8);
  if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_bc8._0_8_);
  }
  cfd::core::Psbt::GetTxInRedeemScript((Script *)local_d28,&local_c18,0,false,(bool *)0x0);
  bVar4 = cfd::core::Psbt::IsFinalizedInput(&local_c18,0);
  local_d88._8_8_ = (pointer)0x0;
  local_d88[0] = (internal)!bVar4;
  if (bVar4) {
    testing::Message::Message((Message *)local_d48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_bc8,(internal *)local_d88,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","true","false",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x36d,(char *)local_bc8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_ce8,(Message *)local_d48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ce8);
    if ((undefined **)local_bc8._0_8_ != ppuVar1) {
      operator_delete((void *)local_bc8._0_8_);
    }
    if ((AssertHelperData *)local_d48._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d48._0_8_ + 8))();
      }
      local_d48._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = cfd::core::Psbt::IsFinalized(&local_c18);
  local_d88[0] = (internal)!bVar4;
  local_d88._8_8_ = (pointer)0x0;
  if (bVar4) {
    testing::Message::Message((Message *)local_d48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_bc8,(internal *)local_d88,(AssertionResult *)"psbt.IsFinalized()",
               "true","false",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x36e,(char *)local_bc8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_ce8,(Message *)local_d48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ce8);
    if ((undefined **)local_bc8._0_8_ != ppuVar1) {
      operator_delete((void *)local_bc8._0_8_);
    }
    if ((AssertHelperData *)local_d48._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d48._0_8_ + 8))();
      }
      local_d48._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ByteData::ByteData((ByteData *)local_bc8);
  local_bc8._24_8_ = 0;
  pSStack_ba8 = (pointer)0x0;
  local_ba0 = (pointer)0x0;
  uVar9 = (long)local_cc8 - local_ce8._24_8_;
  if (uVar9 == 0) {
    pSVar5 = (pointer)0x0;
  }
  else {
    if ((long)uVar9 < 0) {
      std::__throw_bad_alloc();
    }
    pSVar5 = (pointer)operator_new(uVar9);
  }
  local_ba0 = (pointer)(uVar9 + (long)pSVar5);
  sVar10 = (long)local_cc8 - local_ce8._24_8_;
  local_bc8._24_8_ = pSVar5;
  if (sVar10 != 0) {
    pSStack_ba8 = pSVar5;
    memmove(pSVar5,(void *)local_ce8._24_8_,sVar10);
  }
  pSStack_ba8 = (pointer)((long)pSVar5 + sVar10);
  local_b98 = (pointer)0x0;
  pSStack_b90 = (pointer)0x0;
  local_b88 = (pointer)0x0;
  uVar9 = CONCAT71(local_8f0._9_7_,local_8f0[8]) - local_8f0._0_8_;
  if (uVar9 == 0) {
    pSVar5 = (pointer)0x0;
  }
  else {
    if ((long)uVar9 < 0) {
      std::__throw_bad_alloc();
    }
    pSVar5 = (pointer)operator_new(uVar9);
  }
  local_b88 = (pointer)(uVar9 + (long)pSVar5);
  sVar10 = CONCAT71(local_8f0._9_7_,local_8f0[8]) - local_8f0._0_8_;
  local_b98 = pSVar5;
  if (sVar10 != 0) {
    pSStack_b90 = pSVar5;
    memmove(pSVar5,(void *)local_8f0._0_8_,sVar10);
  }
  pSStack_b90 = (pointer)((long)pSVar5 + sVar10);
  cfd::core::Script::GetData(local_b80,(Script *)local_d28);
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)local_bc8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d88,__l_02,
             (allocator_type *)local_d48);
  cfd::core::Psbt::SetTxInFinalScript
            (&local_c18,0,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d88);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_d88);
  lVar6 = 0x48;
  do {
    if (*(void **)(local_bc8 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_bc8 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  bVar4 = cfd::core::Psbt::IsFinalizedInput(&local_c18,0);
  local_d88[0] = (internal)bVar4;
  local_d88._8_8_ = (pointer)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_d48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_bc8,(internal *)local_d88,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","false","true",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x372,(char *)local_bc8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_ce8,(Message *)local_d48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_ce8);
    if ((undefined **)local_bc8._0_8_ != ppuVar1) {
      operator_delete((void *)local_bc8._0_8_);
    }
    if ((AssertHelperData *)local_d48._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d48._0_8_ + 8))();
      }
      local_d48._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::ClearTxInSignData(&local_c18,0);
  cfd::core::Psbt::GetTxInFinalScript
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_ce8,
             &local_c18,0,true);
  cfd::core::Psbt::GetTxInFinalScript(&local_908,&local_c18,0,false);
  local_d48._0_4_ = 4;
  local_d88._0_8_ = ((long)(local_ce8._8_8_ - local_ce8._0_8_) >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_bc8,"4","wit_script.size()",(int *)local_d48,
             (unsigned_long *)local_d88);
  if (local_bc8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d88);
    if ((pointer)local_bc8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_bc8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x377,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d48,(Message *)local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d48);
    if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_d88._0_8_ + 8))();
      }
      local_d88._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_bc8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_ce8._8_8_ - local_ce8._0_8_ == 0x60) {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_bc8,(Script *)local_d28);
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)local_d88,(ByteData *)&((AssertHelperData *)(local_ce8._0_8_ + 0x38))->line
              );
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)local_d48,"script.GetHex()","wit_script[3].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d88);
    if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)auStack_d78) {
      operator_delete((void *)local_d88._0_8_);
    }
    if ((undefined **)local_bc8._0_8_ != ppuVar1) {
      operator_delete((void *)local_bc8._0_8_);
    }
    if ((allocator_type)local_d48[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_bc8);
      if ((pointer)local_d48._8_8_ == (pointer)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d48._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x379,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_d88,(Message *)local_bc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d88);
      if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
          (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
        }
        local_bc8._0_8_ = (undefined **)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_d48 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_d48._0_4_ = 1;
  local_d88._0_8_ =
       ((long)local_908.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_908.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_bc8,"1","wsh_script.size()",(int *)local_d48,
             (unsigned_long *)local_d88);
  if (local_bc8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d88);
    if ((pointer)local_bc8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_bc8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x37b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d48,(Message *)local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d48);
    if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_d88._0_8_ + 8))();
      }
      local_d88._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_bc8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)local_908.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_908.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x18) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_bc8,(Script *)local_d28);
    cfd::core::Script::GetData(&local_878,(Script *)local_bc8);
    cfd::core::ByteData::Serialize(&local_860,&local_878);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_d88,&local_860);
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)local_d48,
               local_908.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_8d8,"exp_script.GetData().Serialize().GetHex()","wsh_script[0].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d48);
    if ((AssertHelperData *)local_d48._0_8_ != (AssertHelperData *)(local_d48 + 0x10)) {
      operator_delete((void *)local_d48._0_8_);
    }
    if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)auStack_d78) {
      operator_delete((void *)local_d88._0_8_);
    }
    if (local_860.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_860.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_878.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_878.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_8d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_d88);
      if (local_8d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_8d0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_d48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x37e,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_d48,(Message *)local_d88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d48);
      if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_d88._0_8_ + 8))();
        }
        local_d88._0_8_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_8d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Script::~Script((Script *)local_bc8);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)local_bc8,&local_c18);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d88,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQcjIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBCNoEAEcwRAIgIGNZN+BRcNg9wyE62zpurmZxMAjkq8OLSRLFaA3sTwwCIDPAinGjB1ewhGPVMOwFjtdAGWj7ML72PUVJchoOSFuEAUcwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSrgABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQcjIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBCNoEAEcwRAIgIGNZN+BRcNg9wyE62zpurmZxMAjkq8OLSRLFaA3sTwwCIDPAinGjB1ewhGPVMOwFjtdAGWj7ML72PUVJchoOSFuEAUcwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSrgABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,(char *)local_bc8._0_8_);
  if ((undefined **)local_bc8._0_8_ != ppuVar1) {
    operator_delete((void *)local_bc8._0_8_);
  }
  if (local_d88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_bc8);
    if ((pointer)local_d88._8_8_ == (pointer)0x0) {
      puVar8 = "";
    }
    else {
      puVar8 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d88._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x380,(char *)puVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d48,(Message *)local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d48);
    if ((undefined **)local_bc8._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_bc8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_bc8._0_8_ + 8))();
      }
      local_bc8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_908);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_ce8);
  cfd::core::Script::~Script((Script *)local_d28);
  if ((pointer)local_8f0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_8f0._0_8_);
  }
  if ((AssertHelperData *)local_ce8._24_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_ce8._24_8_);
  }
  bVar4 = cfd::core::Psbt::IsFinalized(&local_c18);
  local_d28[0] = (internal)bVar4;
  local_d28._8_8_ = (pointer)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_d88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_bc8,(internal *)local_d28,(AssertionResult *)"psbt.IsFinalized()",
               "false","true",(char *)value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x387,(char *)local_bc8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d48,(Message *)local_d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d48);
    if ((undefined **)local_bc8._0_8_ != ppuVar1) {
      operator_delete((void *)local_bc8._0_8_);
    }
    if ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_d88._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_d88._0_8_ + 8))();
      }
      local_d88._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d28 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::ExtractTransaction((Transaction *)local_bc8,&local_c18);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_d28,(AbstractTransaction *)local_bc8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d88,
             "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
             ,"tx.GetHex().c_str()",
             "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
             ,(char *)local_d28._0_8_);
  if ((AssertHelperData *)local_d28._0_8_ != (AssertHelperData *)(local_d28 + 0x10)) {
    operator_delete((void *)local_d28._0_8_);
  }
  if (local_d88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d28);
    if ((pointer)local_d88._8_8_ == (pointer)0x0) {
      puVar8 = "";
    }
    else {
      puVar8 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d88._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x389,(char *)puVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d48,(Message *)local_d28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d48);
    if ((AssertHelperData *)local_d28._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_d28._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_d28._0_8_ + 8))();
      }
      local_d28._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Transaction::~Transaction((Transaction *)local_bc8);
  cfd::core::Psbt::~Psbt(&local_c68);
  cfd::core::Psbt::~Psbt((Psbt *)local_cb8);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_7f0);
  cfd::core::Transaction::~Transaction(&local_760);
  cfd::core::Script::~Script(&local_828);
  cfd::core::KeyData::~KeyData(&local_570);
  cfd::core::KeyData::~KeyData(&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_5a0);
  cfd::core::Script::~Script(&local_5e0);
  local_670._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_5f8);
  cfd::core::TapBranch::~TapBranch(&local_670);
  if (local_688 != (pointer)0x0) {
    operator_delete(local_688);
  }
  if (local_6a0 != (pointer)0x0) {
    operator_delete(local_6a0);
  }
  if (local_6b8 != (pointer)0x0) {
    operator_delete(local_6b8);
  }
  if ((pointer)local_6e8._16_8_ != (pointer)(local_6e8 + 0x20)) {
    operator_delete((void *)local_6e8._16_8_);
  }
  cfd::core::Script::~Script(&local_720);
  cfd::core::KeyData::~KeyData(&local_2d0);
  cfd::core::KeyData::~KeyData(&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p);
  }
  if (local_8c8.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8c8.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8b0.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8b0.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Psbt::~Psbt(&local_c18);
  return;
}

Assistant:

TEST(Psbt, UsecaseMultisig) {
  Psbt psbt;
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/12";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path1);
  auto out_multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key1.GetPubkey(), key2.GetPubkey()});
  auto addr = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_multisig);

  std::string in_path = "44h/0h/0h/0/11";
  auto key_in1 = wallet1.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto key_in2 = wallet2.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key_in1.GetPubkey(), key_in2.GetPubkey()});
  EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", multisig.GetHex().c_str());

  Transaction utxo_tx(g_psbt_utxo_sh_wsh_multi);
  TxIn txin(Txid("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"), 0, 0xffffffff);

  try {
    psbt.AddTxIn(txin);
    psbt.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, KeyData());
    psbt.SetTxInSighashType(0, SigHashType());
    EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae",
        psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str());
    EXPECT_STREQ("00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
        psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Amount amount(499993360);
  try {
    psbt.AddTxOut(addr.GetLockingScript(), amount);
    psbt.SetTxOutData(0, out_multisig, std::vector<KeyData>{key1, key2});
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt1;
  try {
    psbt1.AddTxIn(txin);
    psbt1.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in1);
    EXPECT_STREQ("cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAA", psbt1.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt2;
  try {
    psbt2.AddTxIn(txin);
    psbt2.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in2);
    EXPECT_STREQ("cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAA", psbt2.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    psbt.Join(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt1 = psbt;
    psbt1.Sign(key_in1.GetPrivkey());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    // psbt2.Sign(key_in2.GetPrivkey());
    // Same processing.
    auto sighash_type = psbt.GetTxInSighashType(0);
    auto utxo_txout = psbt.GetTxInUtxo(0);
    auto tx = psbt.GetTransaction();
    auto sighash = tx.GetSignatureHash(0, psbt.GetTxInRedeemScript(0).GetData(),
        sighash_type, utxo_txout.GetValue(), WitnessVersion::kVersion0);
    auto sig = key_in2.GetPrivkey().CalculateEcSignature(sighash);
    sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
    psbt2.SetTxInSignature(0, key_in2, sig);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    auto sig1 = psbt.GetTxInSignature(0, key_in1.GetPubkey());
    auto sig2 = psbt.GetTxInSignature(0, key_in2.GetPubkey());
    auto script = psbt.GetTxInRedeemScript(0);
    EXPECT_FALSE(psbt.IsFinalizedInput(0));
    EXPECT_FALSE(psbt.IsFinalized());
    psbt.SetTxInFinalScript(
        0, std::vector<ByteData>{ByteData(), sig1, sig2, script.GetData()});
    // psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(0));
    psbt.ClearTxInSignData(0);

    auto wit_script = psbt.GetTxInFinalScript(0, true);
    auto wsh_script = psbt.GetTxInFinalScript(0, false);
    EXPECT_EQ(4, wit_script.size());
    if (4 == wit_script.size()) {
      EXPECT_EQ(script.GetHex(), wit_script[3].GetHex());
    }
    EXPECT_EQ(1, wsh_script.size());
    if (1 == wsh_script.size()) {
      auto exp_script = ScriptUtil::CreateP2wshLockingScript(script);
      EXPECT_EQ(exp_script.GetData().Serialize().GetHex(), wsh_script[0].GetHex());
    }
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQcjIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBCNoEAEcwRAIgIGNZN+BRcNg9wyE62zpurmZxMAjkq8OLSRLFaA3sTwwCIDPAinGjB1ewhGPVMOwFjtdAGWj7ML72PUVJchoOSFuEAUcwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSrgABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    EXPECT_TRUE(psbt.IsFinalized());
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", tx.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}